

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SixAxisForceTorqueSensor.cpp
# Opt level: O1

bool __thiscall
iDynTree::SixAxisForceTorqueSensor::getLinkSensorTransform
          (SixAxisForceTorqueSensor *this,LinkIndex link_index,Transform *link_H_sensor)

{
  SixAxisForceTorqueSensorPrivateAttributes *pSVar1;
  long lVar2;
  
  pSVar1 = this->pimpl;
  lVar2 = 0x38;
  if ((pSVar1->link1 != link_index) && (lVar2 = 0x98, pSVar1->link2 != link_index)) {
    return false;
  }
  iDynTree::Transform::operator=
            (link_H_sensor,(Transform *)((long)&(pSVar1->name)._M_dataplus._M_p + lVar2));
  return true;
}

Assistant:

bool SixAxisForceTorqueSensor::getLinkSensorTransform(const LinkIndex link_index, iDynTree::Transform& link_H_sensor) const
{
    if( this->pimpl->link1 == link_index )
    {
        link_H_sensor = this->pimpl->link1_H_sensor;
        return true;
    }

    if( this->pimpl->link2 == link_index )
    {
        link_H_sensor = this->pimpl->link2_H_sensor;
        return true;
    }

    return false;
}